

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

void __thiscall
re2::SparseArray<re2::NFA::Thread_*>::resize(SparseArray<re2::NFA::Thread_*> *this,int new_max_size)

{
  int iVar1;
  int *__first;
  int *__result;
  IndexValue *__first_00;
  IndexValue *__result_00;
  undefined1 local_38 [8];
  PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> b;
  PODArray<int> a;
  int old_max_size;
  int new_max_size_local;
  SparseArray<re2::NFA::Thread_*> *this_local;
  
  DebugCheckInvariants(this);
  iVar1 = max_size(this);
  if (iVar1 < new_max_size) {
    iVar1 = max_size(this);
    PODArray<int>::PODArray
              ((PODArray<int> *)
               &b.ptr_._M_t.
                super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                ._M_t.
                super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>,
               new_max_size);
    PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::PODArray
              ((PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> *)local_38,new_max_size);
    __first = PODArray<int>::data(&this->sparse_);
    __result = PODArray<int>::data((PODArray<int> *)
                                   &b.ptr_._M_t.
                                    super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                                    .
                                    super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>
                                  );
    std::copy_n<int*,int,int*>(__first,iVar1,__result);
    __first_00 = PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::data(&this->dense_);
    __result_00 = PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::data
                            ((PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> *)local_38)
    ;
    std::
    copy_n<re2::SparseArray<re2::NFA::Thread*>::IndexValue*,int,re2::SparseArray<re2::NFA::Thread*>::IndexValue*>
              (__first_00,iVar1,__result_00);
    PODArray<int>::operator=
              (&this->sparse_,
               (PODArray<int> *)
               &b.ptr_._M_t.
                super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                ._M_t.
                super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>);
    PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::operator=
              (&this->dense_,(PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> *)local_38)
    ;
    MaybeInitializeMemory(this,iVar1,new_max_size);
    PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::~PODArray
              ((PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> *)local_38);
    PODArray<int>::~PODArray
              ((PODArray<int> *)
               &b.ptr_._M_t.
                super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                ._M_t.
                super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>);
  }
  if (new_max_size < this->size_) {
    this->size_ = new_max_size;
  }
  DebugCheckInvariants(this);
  return;
}

Assistant:

void SparseArray<Value>::resize(int new_max_size) {
  DebugCheckInvariants();
  if (new_max_size > max_size()) {
    const int old_max_size = max_size();

    // Construct these first for exception safety.
    PODArray<int> a(new_max_size);
    PODArray<IndexValue> b(new_max_size);

    std::copy_n(sparse_.data(), old_max_size, a.data());
    std::copy_n(dense_.data(), old_max_size, b.data());

    sparse_ = std::move(a);
    dense_ = std::move(b);

    MaybeInitializeMemory(old_max_size, new_max_size);
  }
  if (size_ > new_max_size)
    size_ = new_max_size;
  DebugCheckInvariants();
}